

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mempool.c
# Opt level: O1

void mempool_destroy(mempool *pool)

{
  rlist *prVar1;
  rlist *prVar2;
  
  prVar2 = (pool->slabs).slabs.next;
  while ((slab_list *)prVar2 != &pool->slabs) {
    prVar1 = prVar2->next;
    slab_put_with_order(pool->cache,(slab *)(prVar2 + -1));
    prVar2 = prVar1;
  }
  pool->slab_ptr_mask = 0;
  pool->small_mempool = (small_mempool *)0x0;
  pool->objsize = 0;
  pool->slab_order = '\0';
  *(undefined3 *)&pool->field_0x55 = 0;
  pool->objcount = 0;
  pool->offset = 0;
  (pool->cold_slabs).next = (rlist *)0x0;
  pool->spare = (mslab *)0x0;
  pool->first_hot_slab = (mslab *)0x0;
  (pool->cold_slabs).prev = (rlist *)0x0;
  (pool->slabs).stats.total = 0;
  (pool->hot_slabs).rbt_root = (mslab *)0x0;
  (pool->slabs).slabs.next = (rlist *)0x0;
  (pool->slabs).stats.used = 0;
  pool->cache = (slab_cache *)0x0;
  (pool->slabs).slabs.prev = (rlist *)0x0;
  return;
}

Assistant:

void
mempool_destroy(struct mempool *pool)
{
	struct slab *slab, *tmp;
	rlist_foreach_entry_safe(slab, &pool->slabs.slabs,
				 next_in_list, tmp)
		slab_put_with_order(pool->cache, slab);
	/* Safety and also makes mempool_is_initialized work. */
	memset(pool, 0, sizeof(*pool));
}